

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O2

void __thiscall Line::generate_options(Line *this,Known *known)

{
  _Vector_impl_data *p_Var1;
  ulong *puVar2;
  pointer piVar3;
  const_reference cVar4;
  int iVar5;
  pointer *ppiVar6;
  int *piVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  uint uVar9;
  ulong *puVar10;
  pointer piVar11;
  uint uVar12;
  long lVar13;
  pointer piVar14;
  int iVar15;
  ulong *puVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int lower_limit;
  vector<int,_std::allocator<int>_> iterators;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  generated_possibilities;
  vector<int,_std::allocator<int>_> required;
  vector<bool,_std::allocator<bool>_> option;
  int local_c4;
  _Vector_base<int,_std::allocator<int>_> local_c0;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_a8;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  puVar10 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar2 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar19 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar18 = 0;
  for (lVar13 = (long)((ulong)uVar19 + ((long)puVar2 - (long)puVar10) * 8) >> 2;
      uVar12 = (uint)uVar18, 0 < lVar13; lVar13 = lVar13 + -1) {
    puVar16 = puVar10;
    uVar9 = uVar12;
    if ((*puVar10 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_001054b9;
    puVar16 = puVar10 + (uVar12 == 0x3f);
    uVar18 = (ulong)(uVar12 + 1);
    if (uVar12 == 0x3f) {
      uVar18 = 0;
    }
    uVar9 = (uint)uVar18;
    if ((*puVar16 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_001054b9;
    puVar16 = puVar16 + (uVar9 == 0x3f);
    uVar18 = (ulong)(uVar9 + 1);
    if (uVar9 == 0x3f) {
      uVar18 = 0;
    }
    uVar9 = (uint)uVar18;
    if ((*puVar16 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_001054b9;
    uVar18 = 0;
    if (uVar9 != 0x3f) {
      uVar18 = (ulong)(uVar9 + 1);
    }
    uVar12 = (uint)uVar18;
    puVar16 = puVar16 + (uVar9 == 0x3f);
    uVar9 = uVar12;
    if ((*puVar16 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_001054b9;
    uVar18 = 0;
    if (uVar12 != 0x3f) {
      uVar18 = (ulong)(uVar12 + 1);
    }
    puVar10 = puVar16 + (uVar12 == 0x3f);
  }
  lVar13 = (uVar19 - uVar18) + ((long)puVar2 - (long)puVar10) * 8;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      puVar16 = puVar2;
      uVar9 = uVar19;
      if ((lVar13 != 3) ||
         (puVar16 = puVar10, uVar9 = uVar12, (*puVar10 >> (uVar18 & 0x3f) & 1) == 0))
      goto LAB_001054b9;
      uVar18 = 0;
      puVar10 = puVar10 + (uVar12 == 0x3f);
      if (uVar12 != 0x3f) {
        uVar18 = (ulong)(uVar12 + 1);
      }
      uVar12 = (uint)uVar18;
    }
    puVar16 = puVar10;
    uVar9 = uVar12;
    if ((*puVar10 >> (uVar18 & 0x3f) & 1) == 0) goto LAB_001054b9;
    uVar18 = 0;
    puVar10 = puVar10 + (uVar12 == 0x3f);
    if (uVar12 != 0x3f) {
      uVar18 = (ulong)(uVar12 + 1);
    }
    uVar12 = (uint)uVar18;
  }
  puVar16 = puVar10;
  uVar9 = uVar12;
  if ((*puVar10 >> (uVar18 & 0x3f) & 1) != 0) {
    puVar16 = puVar2;
    uVar9 = uVar19;
  }
LAB_001054b9:
  if ((puVar16 == puVar2) && (uVar9 == uVar19)) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_a8,&known->second);
    std::
    vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
    ::_M_assign_aux<std::vector<bool,std::allocator<bool>>const*>
              ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                *)this,&local_a8,
               &local_a8.second.
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&local_a8);
    return;
  }
  generate_possible_per_number(&local_a8,this,known);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
      (uint)local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p <
      this->m_size;
      local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ =
           (uint)local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&known->first,
                       (long)(int)(uint)local_58._M_impl.super__Bvector_impl_data._M_start.
                                        super__Bit_iterator_base._M_p);
    if ((cVar4) &&
       (cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&known->second,
                           (long)(int)(uint)local_58._M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p), cVar4)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_78,(value_type_conflict2 *)&local_58);
    }
  }
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_c0,
             (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_58,
             (allocator_type *)&local_c4);
  do {
    generate_option((vector<bool,_std::allocator<bool>_> *)&local_58,this,
                    (vector<int,_std::allocator<int>_> *)&local_c0,&local_a8.first);
    iVar5 = check_option_by_required
                      ((vector<int,_std::allocator<int>_> *)&local_78,
                       (vector<bool,_std::allocator<bool>_> *)&local_58);
    if (iVar5 == -1) {
      std::
      vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
      ::emplace_back<std::vector<bool,std::allocator<bool>>>
                ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                  *)this,(vector<bool,_std::allocator<bool>_> *)&local_58);
      piVar11 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar14 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar18 = (ulong)((long)piVar14 - (long)piVar11) >> 2 & 0xffffffff;
LAB_0010564b:
      ppiVar6 = &local_a8.first.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18 - 1].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      do {
        iVar15 = (int)uVar18;
        if (iVar15 < 1) {
LAB_00105715:
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c0);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
          std::
          pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::~pair(&local_a8);
          return;
        }
        lVar13 = uVar18 - 1;
        uVar18 = uVar18 - 1;
        piVar3 = *ppiVar6;
        p_Var1 = (_Vector_impl_data *)(ppiVar6 + -1);
        ppiVar6 = ppiVar6 + -3;
      } while (((long)piVar3 - (long)p_Var1->_M_start >> 2) + -1 ==
               (long)local_c0._M_impl.super__Vector_impl_data._M_start[lVar13]);
      piVar7 = local_c0._M_impl.super__Vector_impl_data._M_start + (uVar18 & 0xffffffff);
      iVar17 = *piVar7;
    }
    else {
      piVar11 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar14 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar18 = (ulong)((long)piVar14 - (long)piVar11) >> 2 & 0xffffffff;
      lVar13 = uVar18 + 1;
      do {
        uVar19 = (int)lVar13 - 2;
        if ((int)uVar19 < 0) goto LAB_00105715;
        uVar19 = uVar19 & 0x7fffffff;
        iVar17 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar19];
        piVar3 = local_a8.first.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        lVar13 = lVar13 + -1;
        iVar15 = (int)lVar13;
      } while (iVar5 < piVar3[iVar17]);
      if (((long)local_a8.first.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar3 >> 2) + -1 == (long)iVar17) goto LAB_0010564b;
      piVar7 = local_c0._M_impl.super__Vector_impl_data._M_start + uVar19;
    }
    *piVar7 = iVar17 + 1;
    uVar18 = (ulong)iVar15;
    lVar13 = uVar18 * 0x18;
    for (; uVar18 < (ulong)((long)piVar14 - (long)piVar11 >> 2); uVar18 = uVar18 + 1) {
      local_c4 = *(int *)(*(long *)((long)&local_a8.first.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + lVar13) +
                         (long)local_c0._M_impl.super__Vector_impl_data._M_start[uVar18 - 1] * 4) +
                 piVar11[uVar18 - 1] + 1;
      _Var8 = std::
              __lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_less_val>
                        (*(undefined8 *)
                          ((long)&((local_a8.first.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar13),
                         *(undefined8 *)
                          ((long)&((local_a8.first.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish + lVar13),&local_c4);
      local_c0._M_impl.super__Vector_impl_data._M_start[uVar18] =
           (int)((ulong)((long)_Var8._M_current -
                        *(long *)((long)&((local_a8.first.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + lVar13)) >> 2);
      piVar11 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar14 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar13 = lVar13 + 0x18;
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  } while( true );
}

Assistant:

void Line::generate_options(const Known &known) {
#if DEBUG_LOGS
    Logger(DEBUG).get() << "Originally possible " << get_combinations_number() << " options" << endl;
#endif // DEBUG_LOGS

    if (all_of(known.first.begin(), known.first.end(), [](bool v) { return v; })) {
        m_options = {known.second};

#if DEBUG_LOGS
        Logger(DEBUG).get() << "All known" << endl;
#endif // DEBUG_LOGS

        return;
    }

    auto generated_possibilities = generate_possible_per_number(known);
    vector<vector<int>> &possible_per_number = generated_possibilities.first;
    vector<set<int>> &extended_possible_per_place = generated_possibilities.second;

    // Get known black.
    vector<int> required;
    for (int i = 0; i < m_size; i++) {
        if (known.first[i] && known.second[i]) {
            required.push_back(i);
        }
    }

    vector<int> iterators(m_numbers.size(), 0);
    int index;
    int required_filler;
    int generated = 0;

    // Generate all options for the line.
    while (true) {
        bool advanced = false;
        auto option = generate_option(iterators, possible_per_number);
        generated++;

        int failed_required = check_option_by_required(required, option);
        if (failed_required == -1) {
            m_options.push_back(move(option));
        } else {
            for (required_filler = m_numbers.size() - 1;
                 (required_filler >= 0) && (possible_per_number[required_filler][iterators[required_filler]] >
                                            failed_required); required_filler--);
            if (required_filler < 0) break;
            if (iterators[required_filler] != possible_per_number[required_filler].size() - 1) {
                iterators[required_filler]++;
                advanced = true;
                index = required_filler + 1;
            }
        }

        if (!advanced) {
            for (index = (int) m_numbers.size() - 1;
                 (index >= 0) && (iterators[index] == possible_per_number[index].size() - 1); index--);
            if (index < 0) break;

            iterators[index]++;
            index++;
        }

        for (; index < m_numbers.size(); index++) {
            int lower_limit = possible_per_number[index - 1][iterators[index - 1]] + m_numbers[index - 1] + 1;
            auto t = lower_bound(possible_per_number[index].begin(), possible_per_number[index].end(), lower_limit);
            iterators[index] = t - possible_per_number[index].begin();
        }
    }

#if DEBUG_LOGS
    Logger(DEBUG).get() << "Generated " << m_options.size() << " options (saved "
                        << get_combinations_number() - generated << " by optimization and "
                        << generated - m_options.size() << " by filtering)" << endl;
#endif // DEBUG_LOGS
}